

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int lws_cache_nscookiejar_lookup
              (lws_cache_ttl_lru *_c,char *wildcard_key,lws_dll2_owner_t *results_owner)

{
  int fd_00;
  int iVar1;
  int fd;
  int ret;
  nsc_lookup_ctx ctx;
  lws_cache_nscookiejar_t *cache;
  lws_dll2_owner_t *results_owner_local;
  char *wildcard_key_local;
  lws_cache_ttl_lru *_c_local;
  
  ctx.wklen = (size_t)_c;
  fd_00 = nsc_backing_open_lock((lws_cache_nscookiejar_t *)_c,0,"lws_cache_nscookiejar_lookup");
  if (fd_00 < 0) {
    _c_local._4_4_ = 1;
  }
  else {
    _fd = wildcard_key;
    ctx.wildcard_key = (char *)results_owner;
    ctx.match = (lws_cache_match_t *)strlen(wildcard_key);
    ctx.results_owner = (lws_dll2_owner_t *)0x0;
    iVar1 = nscookiejar_iterate((lws_cache_nscookiejar_t *)ctx.wklen,fd_00,nsc_lookup_cb,&fd);
    nsc_backing_close_unlock((lws_cache_nscookiejar_t *)ctx.wklen,fd_00);
    _c_local._4_4_ = (uint)(iVar1 == -1);
  }
  return _c_local._4_4_;
}

Assistant:

static int
lws_cache_nscookiejar_lookup(struct lws_cache_ttl_lru *_c,
			     const char *wildcard_key,
			     lws_dll2_owner_t *results_owner)
{
	lws_cache_nscookiejar_t *cache = (lws_cache_nscookiejar_t *)_c;
	struct nsc_lookup_ctx ctx;
	int ret, fd;

	fd = nsc_backing_open_lock(cache, LWS_O_RDONLY, __func__);
	if (fd < 0)
		return 1;

	ctx.wildcard_key = wildcard_key;
	ctx.results_owner = results_owner;
	ctx.wklen = strlen(wildcard_key);
	ctx.match = 0;

	ret = nscookiejar_iterate(cache, fd, nsc_lookup_cb, &ctx);
		/*
		 * The cb can fail, eg, with OOM, making the whole lookup
		 * invalid and returning fail.  Caller will clean
		 * results_owner on fail.
		 */
	nsc_backing_close_unlock(cache, fd);

	return ret == NIR_FINISH_ERROR;
}